

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

Var __thiscall Minisat::SimpSolver::newVar(SimpSolver *this,lbool upol,bool dvar)

{
  Lit LVar1;
  int local_20;
  undefined1 local_19;
  Var v;
  bool dvar_local;
  SimpSolver *this_local;
  lbool upol_local;
  
  local_19 = dvar;
  _v = this;
  this_local._7_1_ = upol.value;
  local_20 = Solver::newVar(&this->super_Solver,upol,dvar);
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20,'\0');
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20,
             '\0');
  if ((this->use_simplification & 1U) != 0) {
    LVar1 = mkLit(local_20,false);
    IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::insert
              (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,LVar1,0);
    LVar1 = mkLit(local_20,false);
    LVar1 = operator~(LVar1);
    IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::insert
              (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,LVar1,0);
    OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
    ::init(&this->occurs,(EVP_PKEY_CTX *)&local_20);
    IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
              (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20,'\0'
              );
    Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::insert
              (&this->elim_heap,local_20);
  }
  return local_20;
}

Assistant:

Var SimpSolver::newVar(lbool upol, bool dvar) {
    Var v = Solver::newVar(upol, dvar);

    frozen    .insert(v, (char)false);
    eliminated.insert(v, (char)false);

    if (use_simplification){
        n_occ     .insert( mkLit(v), 0);
        n_occ     .insert(~mkLit(v), 0);
        occurs    .init  (v);
        touched   .insert(v, 0);
        elim_heap .insert(v);
    }
    return v; }